

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::write_significand<fmt::v8::appender,char>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_48;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_40;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_38;
  char local_29;
  int local_28;
  int iStack_24;
  char decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  appender out_local;
  
  local_40 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_29 = decimal_point;
  local_28 = integral_size;
  iStack_24 = significand_size;
  _integral_size_local = significand;
  significand_local =
       (char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  local_38.container =
       (buffer<char> *)
       copy_str_noinline<char,char_const*,fmt::v8::appender>
                 (significand,significand + integral_size,out);
  out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_38.container;
  if (local_29 != '\0') {
    significand_local = (char *)local_38.container;
    local_48.container = (buffer<char> *)appender::operator++((appender *)&significand_local,0);
    this = std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator*(&local_48);
    std::back_insert_iterator<fmt::v8::detail::buffer<char>_>::operator=(this,&local_29);
    out_local = copy_str_noinline<char,char_const*,fmt::v8::appender>
                          (_integral_size_local + local_28,_integral_size_local + iStack_24,
                           (appender)significand_local);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}